

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::translate_table(char_t *buffer,uchar *table)

{
  byte bVar1;
  uchar code;
  uint index;
  char_t ch;
  char_t *write;
  uchar *table_local;
  char_t *buffer_local;
  
  _index = (byte *)buffer;
  table_local = (uchar *)buffer;
  while (*table_local != '\0') {
    bVar1 = *table_local;
    if ((uint)(int)(char)bVar1 < 0x80) {
      bVar1 = table[(uint)(int)(char)bVar1];
      *_index = bVar1;
      _index = _index + (1 - ((int)(uint)bVar1 >> 7));
      table_local = table_local + 1;
    }
    else {
      *_index = bVar1;
      _index = _index + 1;
      table_local = table_local + 1;
    }
  }
  *_index = 0;
  return (char_t *)_index;
}

Assistant:

PUGI_IMPL_FN char_t* translate_table(char_t* buffer, const unsigned char* table)
	{
		char_t* write = buffer;

		while (*buffer)
		{
			char_t ch = *buffer++;
			unsigned int index = static_cast<unsigned int>(ch);

			if (index < 128)
			{
				unsigned char code = table[index];

				// code=128 means "skip character" (table size is 128 so 128 can be a special value)
				// this code skips these characters without extra branches
				*write = static_cast<char_t>(code);
				write += 1 - (code >> 7);
			}
			else
			{
				*write++ = ch;
			}
		}

		// zero-terminate
		*write = 0;

		return write;
	}